

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-stb-image.h
# Opt level: O1

int stbi__psd_decode_rle(stbi__context *s,stbi_uc *p,int pixelCount)

{
  byte bVar1;
  stbi_uc sVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  
  if (0 < pixelCount) {
    iVar6 = 0;
    uVar7 = pixelCount;
    do {
      bVar1 = stbi__get8(s);
      if (bVar1 != 0x80) {
        uVar3 = (uint)bVar1;
        if ((char)bVar1 < '\0') {
          uVar5 = 0x101 - uVar3;
          if (uVar5 <= uVar7) {
            sVar2 = stbi__get8(s);
            iVar4 = uVar3 - 0x101;
            do {
              *p = sVar2;
              p = p + 4;
              iVar4 = iVar4 + 1;
            } while (iVar4 != 0);
            iVar6 = iVar6 + uVar5;
          }
          if (uVar7 < uVar5) {
            return 0;
          }
        }
        else {
          if (uVar7 <= bVar1) {
            return 0;
          }
          iVar4 = uVar3 + 1;
          do {
            sVar2 = stbi__get8(s);
            *p = sVar2;
            p = p + 4;
            iVar4 = iVar4 + -1;
          } while (iVar4 != 0);
          iVar6 = iVar6 + uVar3 + 1;
        }
      }
      uVar7 = pixelCount - iVar6;
    } while (uVar7 != 0 && iVar6 <= pixelCount);
  }
  return 1;
}

Assistant:

static int stbi__psd_decode_rle(stbi__context *s, stbi_uc *p, int pixelCount)
{
   int count, nleft, len;

   count = 0;
   while ((nleft = pixelCount - count) > 0) {
      len = stbi__get8(s);
      if (len == 128) {
         // No-op.
      } else if (len < 128) {
         // Copy next len+1 bytes literally.
         len++;
         if (len > nleft) return 0; // corrupt data
         count += len;
         while (len) {
            *p = stbi__get8(s);
            p += 4;
            len--;
         }
      } else if (len > 128) {
         stbi_uc   val;
         // Next -len+1 bytes in the dest are replicated from next source byte.
         // (Interpret len as a negative 8-bit int.)
         len = 257 - len;
         if (len > nleft) return 0; // corrupt data
         val = stbi__get8(s);
         count += len;
         while (len) {
            *p = val;
            p += 4;
            len--;
         }
      }
   }

   return 1;
}